

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topic_manager.cpp
# Opt level: O0

void __thiscall miniros::TopicManager::getBusStats(TopicManager *this,XmlRpcValue *stats)

{
  bool bVar1;
  XmlRpcValue *in_RDI;
  SubscriptionPtr t_1;
  iterator __end2_1;
  iterator __begin2_1;
  list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
  *__range2_1;
  scoped_lock<std::mutex> lock_1;
  uint32_t sidx;
  PublicationPtr t;
  iterator __end2;
  iterator __begin2;
  V_Publication *__range2;
  scoped_lock<std::recursive_mutex> lock;
  uint32_t pidx;
  XmlRpcValue service_stats;
  XmlRpcValue subscribe_stats;
  XmlRpcValue publish_stats;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  XmlRpcValue *in_stack_fffffffffffffee0;
  XmlRpcValue *in_stack_ffffffffffffff20;
  _Self local_c0;
  _Self local_b8;
  anon_union_8_8_d5adaace_for__value *local_b0;
  int local_9c;
  shared_ptr<miniros::Publication> *local_78;
  __normal_iterator<std::shared_ptr<miniros::Publication>_*,_std::vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>_>
  local_70;
  anon_union_8_8_d5adaace_for__value *local_68;
  int local_54;
  XmlRpcValue local_50 [2];
  anon_union_8_8_d5adaace_for__value in_stack_ffffffffffffffd8;
  XmlRpcValue local_20 [2];
  
  XmlRpc::XmlRpcValue::XmlRpcValue(local_20);
  XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)&stack0xffffffffffffffd0);
  XmlRpc::XmlRpcValue::XmlRpcValue(local_50);
  std::
  vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
  ::size((vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
          *)&in_RDI[6]._value);
  XmlRpc::XmlRpcValue::setSize(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  std::__cxx11::
  list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
  ::size((list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
          *)in_stack_fffffffffffffee0);
  XmlRpc::XmlRpcValue::setSize(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  XmlRpc::XmlRpcValue::setSize(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  local_54 = 0;
  std::scoped_lock<std::recursive_mutex>::scoped_lock
            ((scoped_lock<std::recursive_mutex> *)in_stack_fffffffffffffee0,
             (mutex_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_68 = &in_RDI[6]._value;
  local_70._M_current =
       (shared_ptr<miniros::Publication> *)
       std::
       vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
       ::begin((vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
                *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_78 = (shared_ptr<miniros::Publication> *)
             std::
             vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
             ::end((vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
                    *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<miniros::Publication>_*,_std::vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>_>
                        *)in_stack_fffffffffffffee0,
                       (__normal_iterator<std::shared_ptr<miniros::Publication>_*,_std::vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::Publication>_*,_std::vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>_>
    ::operator*(&local_70);
    std::shared_ptr<miniros::Publication>::shared_ptr
              ((shared_ptr<miniros::Publication> *)in_stack_fffffffffffffee0,
               (shared_ptr<miniros::Publication> *)
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    std::__shared_ptr_access<miniros::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x4fb156);
    Publication::getStats((Publication *)in_stack_ffffffffffffffd8.asTime);
    local_54 = local_54 + 1;
    XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff20,in_RDI);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4fb1af);
    std::shared_ptr<miniros::Publication>::~shared_ptr((shared_ptr<miniros::Publication> *)0x4fb1bc)
    ;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::Publication>_*,_std::vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>_>
    ::operator++(&local_70);
  }
  std::scoped_lock<std::recursive_mutex>::~scoped_lock
            ((scoped_lock<std::recursive_mutex> *)0x4fb27c);
  local_9c = 0;
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_fffffffffffffee0,
             (mutex_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_b0 = &in_RDI[2]._value;
  local_b8._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
       ::begin((list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
                *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_c0._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
       ::end((list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
              *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  while( true ) {
    bVar1 = std::operator!=(&local_b8,&local_c0);
    if (!bVar1) break;
    std::_List_iterator<std::shared_ptr<miniros::Subscription>_>::operator*
              ((_List_iterator<std::shared_ptr<miniros::Subscription>_> *)0x4fb2e9);
    std::shared_ptr<miniros::Subscription>::shared_ptr
              ((shared_ptr<miniros::Subscription> *)in_stack_fffffffffffffee0,
               (shared_ptr<miniros::Subscription> *)
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    std::__shared_ptr_access<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x4fb305);
    Subscription::getStats((Subscription *)in_stack_ffffffffffffffd8.asTime);
    local_9c = local_9c + 1;
    XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff20,in_RDI);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4fb355);
    std::shared_ptr<miniros::Subscription>::~shared_ptr
              ((shared_ptr<miniros::Subscription> *)0x4fb35f);
    std::_List_iterator<std::shared_ptr<miniros::Subscription>_>::operator++(&local_b8);
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4fb3cb);
  XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff20,in_RDI);
  XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff20,in_RDI);
  XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff20,in_RDI);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4fb45c);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4fb469);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4fb476);
  return;
}

Assistant:

void TopicManager::getBusStats(XmlRpcValue& stats)
{
  XmlRpcValue publish_stats, subscribe_stats, service_stats;
  // force these guys to be arrays, even if we don't populate them
  publish_stats.setSize(advertised_topics_.size());
  subscribe_stats.setSize(subscriptions_.size());
  service_stats.setSize(0);

  {
    uint32_t pidx = 0;
    std::scoped_lock<std::recursive_mutex> lock(advertised_topics_mutex_);
    for (PublicationPtr t: advertised_topics_)
      publish_stats[pidx++] = t->getStats();
  }

  {
    uint32_t sidx = 0;
    std::scoped_lock<std::mutex> lock(subs_mutex_);
    for (SubscriptionPtr t: subscriptions_)
      subscribe_stats[sidx++] = t->getStats();
  }

  stats[0] = publish_stats;
  stats[1] = subscribe_stats;
  stats[2] = service_stats;
}